

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemas.c
# Opt level: O1

int xmlSchemaVStart(xmlSchemaValidCtxtPtr vctxt)

{
  xmlElementType nodeType;
  int iVar1;
  int iVar2;
  xmlNodePtr pxVar3;
  int *piVar4;
  char *message;
  char *funcName;
  xmlChar *in_R8;
  int *in_R9;
  xmlSchemaNodeInfoPtr pxVar5;
  xmlNodePtr pxVar6;
  _xmlNode *p_Var7;
  xmlChar *in_stack_ffffffffffffffa8;
  undefined8 in_stack_ffffffffffffffb0;
  
  iVar1 = xmlSchemaPreRun(vctxt);
  if (iVar1 < 0) {
    return -1;
  }
  if (vctxt->doc == (xmlDoc *)0x0) {
    iVar1 = 0;
    if (vctxt->reader != (xmlTextReaderPtr)0x0) goto LAB_00191a98;
    if ((vctxt->sax != (xmlSAXHandlerPtr)0x0) && (vctxt->parserCtxt != (xmlParserCtxtPtr)0x0)) {
      iVar1 = xmlParseDocument(vctxt->parserCtxt);
      goto LAB_00191a98;
    }
    funcName = "xmlSchemaVStart";
    message = "no instance to validate";
  }
  else {
    pxVar3 = vctxt->validationRoot;
    if (pxVar3 == (xmlNodePtr)0x0) {
      pxVar3 = xmlDocGetRootElement(vctxt->doc);
    }
    if (pxVar3 == (xmlNodePtr)0x0) {
      iVar1 = 1;
      xmlSchemaCustomErr4((xmlSchemaAbstractCtxtPtr)vctxt,XML_ERR_INTERNAL_ERROR,(xmlNodePtr)0x0,
                          (xmlSchemaBasicItemPtr)0x0,"The document has no document element",
                          (xmlChar *)0x0,(xmlChar *)0x0,(xmlChar *)0x0,(xmlChar *)0x0);
      goto LAB_00191a98;
    }
    vctxt->depth = -1;
    vctxt->validationRoot = pxVar3;
    pxVar5 = (xmlSchemaNodeInfoPtr)0x0;
    pxVar6 = pxVar3;
LAB_001917da:
    p_Var7 = pxVar6;
    if ((vctxt->skipDepth != -1) && (vctxt->skipDepth <= vctxt->depth)) goto LAB_001919c0;
    nodeType = p_Var7->type;
    if (1 < nodeType - XML_TEXT_NODE) {
      if (nodeType == XML_ELEMENT_NODE) {
        vctxt->depth = vctxt->depth + 1;
        iVar2 = xmlSchemaValidatorPushElem(vctxt);
        iVar1 = -1;
        if (iVar2 == -1) goto LAB_00191a98;
        pxVar5 = vctxt->inode;
        pxVar5->node = p_Var7;
        pxVar5->nodeLine = (uint)p_Var7->line;
        pxVar5->localName = p_Var7->name;
        if (p_Var7->ns != (xmlNs *)0x0) {
          pxVar5->nsName = p_Var7->ns->href;
        }
        *(byte *)&pxVar5->flags = (byte)pxVar5->flags | 0x20;
        vctxt->nbAttrInfos = 0;
        for (pxVar6 = (xmlNodePtr)p_Var7->properties; pxVar6 != (xmlNodePtr)0x0;
            pxVar6 = pxVar6->next) {
          if (pxVar6->ns == (xmlNs *)0x0) {
            in_R8 = (xmlChar *)0x0;
          }
          else {
            in_R8 = pxVar6->ns->href;
          }
          piVar4 = (int *)xmlNodeListGetString(pxVar6->doc,pxVar6->children,1);
          in_R9 = piVar4;
          iVar2 = xmlSchemaValidatorPushAttribute
                            (vctxt,pxVar6,pxVar5->nodeLine,pxVar6->name,in_R8,(int)piVar4,
                             in_stack_ffffffffffffffa8,(int)in_stack_ffffffffffffffb0);
          if (iVar2 == -1) {
            xmlSchemaInternalErr2
                      ((xmlSchemaAbstractCtxtPtr)vctxt,"xmlSchemaDocWalk",
                       "calling xmlSchemaValidatorPushAttribute()",(xmlChar *)0x0,in_R8);
            (*xmlFree)(piVar4);
            goto LAB_00191a98;
          }
        }
        iVar2 = xmlSchemaValidateElem(vctxt);
        if (iVar2 != 0) {
          if (iVar2 != -1) goto LAB_00191993;
          xmlSchemaInternalErr2
                    ((xmlSchemaAbstractCtxtPtr)vctxt,"xmlSchemaDocWalk",
                     "calling xmlSchemaValidateElem()",(xmlChar *)0x0,in_R8);
          goto LAB_00191a98;
        }
        if ((vctxt->skipDepth == -1) || (vctxt->depth < vctxt->skipDepth)) goto LAB_0019184b;
      }
      else if (nodeType - XML_ENTITY_REF_NODE < 2) {
        funcName = "xmlSchemaVDocWalk";
        message = 
        "there is at least one entity reference in the node-tree currently being validated. Processing of entities with this XML Schema processor is not supported (yet). Please substitute entities before validation."
        ;
        goto LAB_00191a89;
      }
      goto LAB_00191993;
    }
    if ((pxVar5 != (xmlSchemaNodeInfoPtr)0x0) && ((pxVar5->flags & 0x20U) != 0)) {
      pxVar5->flags = pxVar5->flags & 0xffffffdf;
    }
    in_R8 = &DAT_00000001;
    iVar1 = xmlSchemaVPushText(vctxt,nodeType,p_Var7->content,-1,1,in_R9);
    if (-1 < iVar1) goto LAB_0019184b;
    funcName = "xmlSchemaVDocWalk";
    message = "calling xmlSchemaVPushText()";
  }
LAB_00191a89:
  xmlSchemaInternalErr2((xmlSchemaAbstractCtxtPtr)vctxt,funcName,message,(xmlChar *)0x0,in_R8);
  iVar1 = -1;
LAB_00191a98:
  xmlSchemaPostRun(vctxt);
  if (iVar1 == 0) {
    iVar1 = vctxt->err;
  }
  return iVar1;
LAB_0019184b:
  pxVar6 = p_Var7->children;
  if (p_Var7->children != (_xmlNode *)0x0) goto LAB_001917da;
LAB_00191993:
  while( true ) {
    if (p_Var7->type == XML_ELEMENT_NODE) {
      if (p_Var7 != vctxt->inode->node) {
        funcName = "xmlSchemaVDocWalk";
        message = "element position mismatch";
        goto LAB_00191a89;
      }
      iVar1 = xmlSchemaValidatorPopElem(vctxt);
      if (iVar1 < 0) {
        funcName = "xmlSchemaVDocWalk";
        message = "calling xmlSchemaValidatorPopElem()";
        goto LAB_00191a89;
      }
      if (p_Var7 == pxVar3) goto LAB_00191a98;
    }
LAB_001919c0:
    pxVar6 = p_Var7->next;
    if (p_Var7->next != (_xmlNode *)0x0) break;
    p_Var7 = p_Var7->parent;
  }
  goto LAB_001917da;
}

Assistant:

static int
xmlSchemaVStart(xmlSchemaValidCtxtPtr vctxt)
{
    int ret = 0;

    if (xmlSchemaPreRun(vctxt) < 0)
        return(-1);

    if (vctxt->doc != NULL) {
	/*
	 * Tree validation.
	 */
	ret = xmlSchemaVDocWalk(vctxt);
#ifdef LIBXML_READER_ENABLED
    } else if (vctxt->reader != NULL) {
	/*
	 * XML Reader validation.
	 */
#ifdef XML_SCHEMA_READER_ENABLED
	ret = xmlSchemaVReaderWalk(vctxt);
#endif
#endif
    } else if ((vctxt->sax != NULL) && (vctxt->parserCtxt != NULL)) {
	/*
	 * SAX validation.
	 */
	ret = xmlParseDocument(vctxt->parserCtxt);
    } else {
	VERROR_INT("xmlSchemaVStart",
	    "no instance to validate");
	ret = -1;
    }

    xmlSchemaPostRun(vctxt);
    if (ret == 0)
	ret = vctxt->err;
    return (ret);
}